

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

PendingComponent * __thiscall
cmComputeLinkDepends::MakePendingComponent(cmComputeLinkDepends *this,uint component)

{
  NodeList *nl;
  pointer pcVar1;
  int iVar2;
  mapped_type *pmVar3;
  pointer piVar4;
  pointer __v;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  pmVar3 = std::
           map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
           ::operator[](&this->PendingComponents,
                        (this->ComponentOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start + component);
  pmVar3->Id = component;
  pcVar1 = (this->CCG->Components).
           super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  __v = *(pointer *)
         &pcVar1[(int)component].super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl;
  piVar4 = *(pointer *)
            ((long)&pcVar1[(int)component].super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  iVar2 = 1;
  if ((long)piVar4 - (long)__v != 4) {
    nl = pcVar1 + (int)component;
    iVar2 = ComputeComponentCount(this,nl);
    __v = (nl->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (nl->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
  }
  pmVar3->Count = iVar2;
  if (__v != piVar4) {
    local_38._M_t = &(pmVar3->Entries)._M_t;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &pmVar3->Entries,
                 (const_iterator)&(pmVar3->Entries)._M_t._M_impl.super__Rb_tree_header,__v,&local_38
                );
      __v = __v + 1;
    } while (__v != piVar4);
  }
  return pmVar3;
}

Assistant:

cmComputeLinkDepends::PendingComponent&
cmComputeLinkDepends::MakePendingComponent(unsigned int component)
{
  // Create an entry (in topological order) for the component.
  PendingComponent& pc =
    this->PendingComponents[this->ComponentOrder[component]];
  pc.Id = component;
  NodeList const& nl = this->CCG->GetComponent(component);

  if (nl.size() == 1) {
    // Trivial components need be seen only once.
    pc.Count = 1;
  } else {
    // This is a non-trivial strongly connected component of the
    // original graph.  It consists of two or more libraries
    // (archives) that mutually require objects from one another.  In
    // the worst case we may have to repeat the list of libraries as
    // many times as there are object files in the biggest archive.
    // For now we just list them twice.
    //
    // The list of items in the component has been sorted by the order
    // of discovery in the original BFS of dependencies.  This has the
    // advantage that the item directly linked by a target requiring
    // this component will come first which minimizes the number of
    // repeats needed.
    pc.Count = this->ComputeComponentCount(nl);
  }

  // Store the entries to be seen.
  pc.Entries.insert(nl.begin(), nl.end());

  return pc;
}